

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pub.cpp
# Opt level: O2

event_queue_t * __thiscall
so_5::disp::active_group::impl::
dispatcher_template_t<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::activity_tracking_impl_t>_>
::query_thread_for_group
          (dispatcher_template_t<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::activity_tracking_impl_t>_>
           *this,string *group_name)

{
  anon_class_24_3_35542624 main_action;
  iterator iVar1;
  exception_t *this_00;
  allocator local_61;
  shared_ptr<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::activity_tracking_impl_t>_>
  thread;
  
  std::mutex::lock(&this->m_lock);
  if (this->m_shutdown_started != true) {
    iVar1 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_so_5::disp::active_group::impl::dispatcher_template_t<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::activity_tracking_impl_t>_>::thread_with_refcounter_t>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_so_5::disp::active_group::impl::dispatcher_template_t<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::activity_tracking_impl_t>_>::thread_with_refcounter_t>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_so_5::disp::active_group::impl::dispatcher_template_t<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::activity_tracking_impl_t>_>::thread_with_refcounter_t>_>_>
            ::find(&(this->m_groups)._M_t,group_name);
    if (&(this->m_groups)._M_t._M_impl.super__Rb_tree_header == (_Rb_tree_header *)iVar1._M_node) {
      std::
      make_shared<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::activity_tracking_impl_t>,std::function<std::unique_ptr<so_5::disp::mpsc_queue_traits::lock_t,std::default_delete<so_5::disp::mpsc_queue_traits::lock_t>>()>const&>
                ((function<std::unique_ptr<so_5::disp::mpsc_queue_traits::lock_t,_std::default_delete<so_5::disp::mpsc_queue_traits::lock_t>_>_()>
                  *)&thread);
      reuse::work_thread::details::
      work_thread_template_t<so_5::disp::reuse::work_thread::details::activity_tracking_impl_t>::
      start(thread.
            super___shared_ptr<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::activity_tracking_impl_t>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr);
      main_action.group_name = group_name;
      main_action.this = this;
      main_action.thread = &thread;
      details::
      do_with_rollback_on_exception<so_5::disp::active_group::impl::dispatcher_template_t<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::activity_tracking_impl_t>>::query_thread_for_group(std::__cxx11::string_const&)::_lambda()_1_,so_5::disp::active_group::impl::dispatcher_template_t<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::activity_tracking_impl_t>>::query_thread_for_group(std::__cxx11::string_const&)::_lambda()_2_>
                (main_action,&thread);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&thread.
                  super___shared_ptr<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::activity_tracking_impl_t>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
    }
    else {
      iVar1._M_node[2]._M_left = (_Base_ptr)((long)&(iVar1._M_node[2]._M_left)->_M_color + 1);
      thread.
      super___shared_ptr<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::activity_tracking_impl_t>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = *(element_type **)(iVar1._M_node + 2);
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->m_lock);
    return &((thread.
              super___shared_ptr<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::activity_tracking_impl_t>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr)->super_activity_tracking_impl_t).
            super_common_data_t<so_5::disp::reuse::work_thread::demand_queue_details::queue_template_t<so_5::disp::reuse::work_thread::demand_queue_details::with_activity_tracking_impl_t>_>
            .m_queue.super_event_queue_t;
  }
  this_00 = (exception_t *)__cxa_allocate_exception(0x18);
  std::__cxx11::string::string((string *)&thread,"shutdown was initiated",&local_61);
  exception_t::exception_t(this_00,(string *)&thread,0x1f);
  __cxa_throw(this_00,&exception_t::typeinfo,exception_t::~exception_t);
}

Assistant:

virtual so_5::event_queue_t *
		query_thread_for_group( const std::string & group_name ) override
			{
				std::lock_guard< std::mutex > lock( m_lock );

				if( m_shutdown_started )
					throw so_5::exception_t(
						"shutdown was initiated",
						rc_disp_create_failed );

				auto it = m_groups.find( group_name );

				// If there is a thread for an active group it should be returned.
				if( m_groups.end() != it )
					{
						++(it->second.m_user_agent);
						return it->second.m_thread->get_agent_binding();
					}

				// New thread should be created.
				auto thread = std::make_shared< WORK_THREAD >(
						m_params.queue_params().lock_factory() );

				thread->start();

				so_5::details::do_with_rollback_on_exception(
						[&] {
							m_groups.emplace(
									group_name,
									thread_with_refcounter_t( thread, 1u ) );
						},
						[&thread] { shutdown_and_wait( *thread ); } );

				return thread->get_agent_binding();
			}